

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom js_get_atom_index(JSRuntime *rt,JSAtomStruct *p)

{
  JSAtomStruct *p1;
  uint32_t i;
  JSAtomStruct *p_local;
  JSRuntime *rt_local;
  
  i = p->hash_next;
  if ((uint)((ulong)*(undefined8 *)&p->field_0x4 >> 0x3e) != 3) {
    i = rt->atom_hash
        [(int)((uint)((ulong)*(undefined8 *)&p->field_0x4 >> 0x20) & 0x3fffffff &
              rt->atom_hash_size - 1U)];
    p1 = rt->atom_array[i];
    while (p1 != p) {
      i = p1->hash_next;
      p1 = rt->atom_array[i];
    }
  }
  return i;
}

Assistant:

static JSAtom js_get_atom_index(JSRuntime *rt, JSAtomStruct *p)
{
    uint32_t i = p->hash_next;  /* atom_index */
    if (p->atom_type != JS_ATOM_TYPE_SYMBOL) {
        JSAtomStruct *p1;

        i = rt->atom_hash[p->hash & (rt->atom_hash_size - 1)];
        p1 = rt->atom_array[i];
        while (p1 != p) {
            assert(i != 0);
            i = p1->hash_next;
            p1 = rt->atom_array[i];
        }
    }
    return i;
}